

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_log.cpp
# Opt level: O0

int mpp_get_log_level(void)

{
  RK_U32 local_c [2];
  int level;
  
  mpp_env_get_u32("mpp_log_level",local_c,mpp_log_level);
  if (((int)local_c[0] < 1) || (7 < (int)local_c[0])) {
    local_c[0] = 4;
  }
  mpp_log_level = local_c[0];
  return local_c[0];
}

Assistant:

int mpp_get_log_level(void)
{
    int level;

    mpp_env_get_u32("mpp_log_level", (RK_U32 *)&level, mpp_log_level);

    if (level <= MPP_LOG_UNKNOWN || level > MPP_LOG_SILENT)
        level = MPP_LOG_INFO;

    mpp_log_level = level;

    return level;
}